

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O1

bool __thiscall Gluco::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *this_00;
  int64_t *piVar1;
  vec<Gluco::Lit> *out_clause;
  uint uVar2;
  uint *puVar3;
  char *pcVar4;
  Watcher *__ptr;
  Var v_00;
  int iVar5;
  ulong uVar6;
  vec<unsigned_int> *pvVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  vec<unsigned_int> *pvVar12;
  vec<Gluco::Solver::Watcher> *pvVar13;
  ulong uVar14;
  bool bVar15;
  vec<unsigned_int> neg;
  int clause_size;
  Var local_8c;
  vec<unsigned_int> local_88;
  vec<unsigned_int> local_78;
  uint local_60;
  int local_5c;
  vec<unsigned_int> *local_58;
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *local_50;
  long local_48;
  uint *local_40;
  uint *local_38;
  
  local_8c = v;
  if ((this->frozen).data[v] != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,0x1f1,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  if ((0 < (this->eliminated).sz) && ((this->eliminated).data[v] != '\0')) {
    __assert_fail("!isEliminated(v)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,0x1f2,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  if (((this->super_Solver).assigns.data[v].value & 2) == 0) {
    __assert_fail("value(v) == l_Undef",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,499,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  this_00 = &this->occurs;
  if ((this->occurs).dirty.data[v] != '\0') {
    OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clean
              (this_00,&local_8c);
  }
  pvVar7 = (this_00->occs).data;
  pvVar12 = pvVar7 + local_8c;
  local_78.data = (uint *)0x0;
  local_78.sz = 0;
  local_78.cap = 0;
  local_88.data = (uint *)0x0;
  local_88.sz = 0;
  local_88.cap = 0;
  local_50 = this_00;
  if (0 < pvVar7[local_8c].sz) {
    lVar11 = 0;
    do {
      uVar2 = pvVar12->data[lVar11];
      if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar2)
      goto LAB_005c502e;
      puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      uVar6 = *(ulong *)(puVar3 + uVar2) >> 0x20;
      iVar5 = (int)(*(ulong *)(puVar3 + uVar2) >> 0x20);
      bVar15 = 0 < iVar5;
      if (0 < iVar5) {
        bVar15 = true;
        if (puVar3[(ulong)uVar2 + 3] != local_8c * 2) {
          lVar9 = 0;
          do {
            lVar8 = lVar9;
            if (uVar6 - 1 == lVar8) break;
            lVar9 = lVar8 + 1;
          } while (puVar3[(ulong)uVar2 + lVar8 + 4] != local_8c * 2);
          bVar15 = lVar8 + 1U < uVar6;
        }
      }
      pvVar7 = &local_88;
      if (bVar15) {
        pvVar7 = &local_78;
      }
      vec<unsigned_int>::push(pvVar7,pvVar12->data + lVar11);
      lVar11 = lVar11 + 1;
    } while (lVar11 < pvVar12->sz);
  }
  v_00 = local_8c;
  local_5c = 0;
  local_48 = (long)local_78.sz;
  local_58 = pvVar12;
  if (0 < local_48) {
    iVar5 = local_88.sz;
    uVar6 = local_88._8_8_ & 0xffffffff;
    local_38 = local_78.data;
    local_40 = local_88.data;
    lVar11 = 0;
    iVar10 = 0;
    do {
      if (0 < iVar5) {
        uVar14 = 0;
        do {
          uVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz;
          if ((uVar2 <= local_38[lVar11]) || (uVar2 <= local_40[uVar14])) goto LAB_005c502e;
          puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          bVar15 = merge(this,(Clause *)(puVar3 + local_38[lVar11]),
                         (Clause *)(puVar3 + local_40[uVar14]),v_00,&local_5c);
          if (bVar15) {
            if (iVar10 < this->grow + local_58->sz) {
              iVar10 = iVar10 + 1;
              if ((this->clause_lim == -1) || (local_5c <= this->clause_lim)) goto LAB_005c4cbd;
            }
            bVar15 = true;
            goto LAB_005c4fd9;
          }
LAB_005c4cbd:
          uVar14 = uVar14 + 1;
        } while (uVar6 != uVar14);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != local_48);
  }
  pvVar12 = local_58;
  (this->eliminated).data[local_8c] = '\x01';
  lVar11 = (long)local_8c;
  pcVar4 = (this->super_Solver).decision.data;
  if (pcVar4[lVar11] != '\0') {
    piVar1 = &(this->super_Solver).dec_vars;
    *piVar1 = *piVar1 + -1;
  }
  pcVar4[lVar11] = '\0';
  if ((((this->super_Solver).order_heap.indices.sz <= local_8c) ||
      ((this->super_Solver).order_heap.indices.data[lVar11] < 0)) &&
     ((this->super_Solver).decision.data[lVar11] != '\0')) {
    Heap<Gluco::Solver::VarOrderLt>::insert(&(this->super_Solver).order_heap,local_8c);
  }
  this->eliminated_vars = this->eliminated_vars + 1;
  if (local_88.sz < local_78.sz) {
    if (0 < local_88.sz) {
      lVar11 = 0;
      do {
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= local_88.data[lVar11])
        {
LAB_005c502e:
          __assert_fail("r >= 0 && r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Alloc.h"
                        ,0x42,
                        "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        mkElimClause(&this->elimclauses,local_8c,
                     (Clause *)
                     ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                     local_88.data[lVar11]));
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_88.sz);
    }
    local_60 = local_8c * 2;
    vec<unsigned_int>::push(&this->elimclauses,&local_60);
    local_60 = 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_60);
    pvVar7 = &local_88;
  }
  else {
    if (0 < local_78.sz) {
      lVar11 = 0;
      do {
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= local_78.data[lVar11])
        goto LAB_005c502e;
        mkElimClause(&this->elimclauses,local_8c,
                     (Clause *)
                     ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                     local_78.data[lVar11]));
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_78.sz);
    }
    local_60 = local_8c * 2 + 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_60);
    local_60 = 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_60);
    pvVar7 = &local_78;
  }
  this->eliminated_clauses = this->eliminated_clauses + pvVar7->sz;
  if (0 < local_78.sz) {
    out_clause = &(this->super_Solver).add_tmp;
    lVar11 = 0;
    do {
      if (0 < local_88.sz) {
        lVar9 = 0;
        do {
          uVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz;
          if ((uVar2 <= local_78.data[lVar11]) || (uVar2 <= local_88.data[lVar9]))
          goto LAB_005c502e;
          puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          bVar15 = merge(this,(Clause *)(puVar3 + local_78.data[lVar11]),
                         (Clause *)(puVar3 + local_88.data[lVar9]),local_8c,out_clause);
          if (bVar15) {
            bVar15 = addClause_(this,out_clause);
            if (!bVar15) {
              bVar15 = false;
              goto LAB_005c4fd9;
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_88.sz);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < local_78.sz);
  }
  if (0 < pvVar12->sz) {
    lVar11 = 0;
    do {
      removeClause(this,pvVar12->data[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < pvVar12->sz);
  }
  pvVar12 = (local_50->occs).data;
  puVar3 = pvVar12[local_8c].data;
  if (puVar3 != (uint *)0x0) {
    pvVar12 = pvVar12 + local_8c;
    pvVar12->sz = 0;
    free(puVar3);
    pvVar12->data = (uint *)0x0;
    pvVar12->cap = 0;
  }
  pvVar13 = (this->super_Solver).watches.occs.data;
  if (pvVar13[(long)local_8c * 2].sz == 0) {
    pvVar13 = pvVar13 + (long)local_8c * 2;
    if (pvVar13->data != (Watcher *)0x0) {
      pvVar13->sz = 0;
      free(pvVar13->data);
      pvVar13->data = (Watcher *)0x0;
      pvVar13->cap = 0;
    }
  }
  lVar11 = (long)local_8c;
  pvVar13 = (this->super_Solver).watches.occs.data;
  if (pvVar13[lVar11 * 2 + 1].sz == 0) {
    __ptr = pvVar13[lVar11 * 2 + 1].data;
    if (__ptr != (Watcher *)0x0) {
      pvVar13[lVar11 * 2 + 1].sz = 0;
      free(__ptr);
      pvVar13[lVar11 * 2 + 1].data = (Watcher *)0x0;
      pvVar13[lVar11 * 2 + 1].cap = 0;
    }
  }
  bVar15 = backwardSubsumptionCheck(this,false);
LAB_005c4fd9:
  if (local_88.data != (uint *)0x0) {
    local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
    free(local_88.data);
    local_88.data = (uint *)0x0;
    local_88._8_8_ = local_88._8_8_ & 0xffffffff;
  }
  if (local_78.data != (uint *)0x0) {
    local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
    free(local_78.data);
  }
  return bVar15;
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    int i, j;
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (i = 0; i < pos.size(); i++)
        for (j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses:
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
        eliminated_clauses += neg.size();
    }else{
        for (i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
        eliminated_clauses += pos.size();
    }


    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (i = 0; i < pos.size(); i++)
        for (j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    for (i = 0; i < cls.size(); i++)
        removeClause(cls[i]);

    // Free occurs list for this variable:
    occurs[v].clear(true);

    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}